

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cc
# Opt level: O2

bool woff2::FixChecksums(Font *font)

{
  _Rb_tree_header *p_Var1;
  ushort uVar2;
  uint8_t *dst;
  ushort uVar3;
  bool bVar4;
  int iVar5;
  Table *pTVar6;
  _Base_ptr p_Var7;
  uint uVar8;
  Table *pTVar9;
  int iVar10;
  uint uVar11;
  _Base_ptr p_Var12;
  size_t local_38;
  
  pTVar6 = Font::FindTable(font,0x68656164);
  if (pTVar6 == (Table *)0x0) {
    iVar10 = 0;
  }
  else {
    pTVar9 = pTVar6->reuse_of;
    if (pTVar6->reuse_of == (Table *)0x0) {
      pTVar9 = pTVar6;
    }
    iVar10 = 0;
    if (0xb < pTVar9->length) {
      dst = (pTVar9->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start;
      dst[8] = '\0';
      dst[9] = '\0';
      dst[10] = '\0';
      dst[0xb] = '\0';
      p_Var1 = &(font->tables)._M_t._M_impl.super__Rb_tree_header;
      for (p_Var7 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7))
      {
        p_Var12 = (_Base_ptr)&p_Var7[1]._M_parent;
        bVar4 = Font::Table::IsReused((Table *)p_Var12);
        if (bVar4) {
          p_Var12 = p_Var7[2]._M_right;
        }
        iVar5 = woff2::ComputeULongSum
                          ((uchar *)p_Var12->_M_left,(ulong)*(uint *)((long)&p_Var12->_M_parent + 4)
                          );
        *(int *)&p_Var12->field_0x4 = iVar5;
        iVar10 = iVar10 + iVar5;
      }
      uVar2 = font->num_tables;
      uVar3 = 0xf;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar8 = (uint)uVar3;
      if (uVar2 == 0) {
        uVar8 = 0;
      }
      uVar11 = 0;
      if ((short)uVar8 != 0) {
        uVar11 = 0x10 << ((byte)uVar8 & 0x1f) & 0xffff;
      }
      iVar5 = (uVar8 + uVar2) * 0x10000 + font->flavor + uVar11 +
              ((uint)uVar2 * 0x10 - uVar11 & 0xffff);
      for (p_Var7 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7))
      {
        p_Var12 = (_Base_ptr)&p_Var7[1]._M_parent;
        bVar4 = Font::Table::IsReused((Table *)p_Var12);
        if (bVar4) {
          p_Var12 = p_Var7[2]._M_right;
        }
        iVar5 = iVar5 + *(int *)((long)&p_Var12->_M_parent + 4) + *(int *)&p_Var12->field_0x4 +
                        *(int *)&p_Var12->_M_parent + p_Var12->_M_color;
      }
      local_38 = 8;
      StoreU32(0xb1b0afba - (iVar10 + iVar5),&local_38,dst);
      iVar10 = 1;
    }
  }
  return SUB41(iVar10,0);
}

Assistant:

bool FixChecksums(Font* font) {
  Font::Table* head_table = font->FindTable(kHeadTableTag);
  if (head_table == NULL) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (head_table->reuse_of != NULL) {
    head_table = head_table->reuse_of;
  }
  if (head_table->length < 12) {
    return FONT_COMPRESSION_FAILURE();
  }

  uint8_t* head_buf = &head_table->buffer[0];
  size_t offset = 8;
  StoreU32(0, &offset, head_buf);
  uint32_t file_checksum = 0;
  uint32_t head_checksum = 0;
  for (auto& i : font->tables) {
    Font::Table* table = &i.second;
    if (table->IsReused()) {
      table = table->reuse_of;
    }
    table->checksum = ComputeULongSum(table->data, table->length);
    file_checksum += table->checksum;

    if (table->tag == kHeadTableTag) {
      head_checksum = table->checksum;
    }
  }

  file_checksum += ComputeHeaderChecksum(*font);
  offset = 8;
  StoreU32(0xb1b0afba - file_checksum, &offset, head_buf);

  return true;
}